

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

deBool vk::BinaryRegistryDetail::BinaryIndexHashImpl_insert
                 (BinaryIndexHashImpl *hash,ProgramBinary *key,deUint32 value)

{
  int iVar1;
  deBool dVar2;
  deUint32 dVar3;
  BinaryIndexHashImplSlot *pBVar4;
  BinaryIndexHashImplSlot *pBVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  iVar1 = hash->slotTableSize;
  iVar7 = hash->numElements + 1;
  if (SBORROW4(iVar7,iVar1 * 4) == iVar7 + iVar1 * -4 < 0) {
    iVar7 = 4;
    if (4 < iVar1 * 2) {
      iVar7 = iVar1 * 2;
    }
    dVar2 = BinaryIndexHashImpl_rehash(hash,iVar7);
    if (dVar2 != 0) goto LAB_008c35ec;
LAB_008c365d:
    dVar2 = 0;
  }
  else {
LAB_008c35ec:
    dVar3 = anon_unknown_8::binaryHash(key);
    uVar8 = hash->slotTableSize - 1U & dVar3;
    pBVar4 = hash->slotTable[(int)uVar8];
    if (hash->slotTable[(int)uVar8] == (BinaryIndexHashImplSlot *)0x0) {
      pBVar4 = BinaryIndexHashImpl_allocSlot(hash);
      if (pBVar4 == (BinaryIndexHashImplSlot *)0x0) goto LAB_008c365d;
      hash->slotTable[(int)uVar8] = pBVar4;
    }
    while (pBVar5 = pBVar4, lVar6 = (long)pBVar5->numUsed, lVar6 == 4) {
      pBVar4 = pBVar5->nextSlot;
      if (pBVar5->nextSlot == (BinaryIndexHashImplSlot *)0x0) {
        pBVar4 = BinaryIndexHashImpl_allocSlot(hash);
        if (pBVar4 == (BinaryIndexHashImplSlot *)0x0) goto LAB_008c365d;
        pBVar5->nextSlot = pBVar4;
      }
    }
    pBVar5->keys[lVar6] = key;
    pBVar5->values[lVar6] = value;
    pBVar5->numUsed = pBVar5->numUsed + 1;
    hash->numElements = hash->numElements + 1;
    dVar2 = 1;
  }
  return dVar2;
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}